

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_util.c
# Opt level: O3

void dill_mark_branch_location(dill_stream_conflict s,int label)

{
  private_ctx pdVar1;
  char *pcVar2;
  char *pcVar3;
  branch_location *pbVar4;
  int iVar5;
  
  pdVar1 = s->p;
  pcVar2 = pdVar1->code_base;
  pcVar3 = pdVar1->cur_ip;
  iVar5 = (pdVar1->branch_table).branch_count;
  if (iVar5 == (pdVar1->branch_table).branch_alloc) {
    (pdVar1->branch_table).branch_alloc = iVar5 + 1;
    pbVar4 = (branch_location *)dill_realloc((pdVar1->branch_table).branch_locs,(long)iVar5 * 8 + 8)
    ;
    (pdVar1->branch_table).branch_locs = pbVar4;
    iVar5 = (pdVar1->branch_table).branch_count;
  }
  else {
    pbVar4 = (pdVar1->branch_table).branch_locs;
  }
  pbVar4[iVar5].label = label;
  pbVar4[iVar5].loc = (int)pcVar3 - (int)pcVar2;
  (pdVar1->branch_table).branch_count = iVar5 + 1;
  return;
}

Assistant:

extern void
dill_mark_branch_location(dill_stream s, int label)
{
    struct branch_table* t = &s->p->branch_table;
    int branch_loc = (int)((char*)s->p->cur_ip - (char*)s->p->code_base);

    if (t->branch_count == t->branch_alloc) {
        t->branch_alloc++;
        t->branch_locs = realloc(
            t->branch_locs, sizeof(struct branch_location) * t->branch_alloc);
    }
    t->branch_locs[t->branch_count].label = label;
    t->branch_locs[t->branch_count].loc = branch_loc;
    t->branch_count++;
}